

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

StoreRegKind get_storage2(DisasContext_conflict1 *s,int rd,int *as)

{
  StoreRegKind SVar1;
  
  if (rd == 0xd) {
    SVar1 = STREG_SP_CHECK;
  }
  else {
    SVar1 = STREG_NORMAL;
    if ((rd == 0xf) && (*as != 0)) {
      if ((s->user == 0) && (s->current_el != 2)) {
        *as = 0;
        SVar1 = STREG_EXC_RET;
      }
      else {
        unallocated_encoding_aarch64(s);
      }
    }
  }
  return SVar1;
}

Assistant:

static StoreRegKind get_storage2(DisasContext *s, int rd, int *as)
{
    StoreRegKind ret = STREG_NORMAL;
    if (rd == 15 && *as) {
        /*
         * See ALUExceptionReturn:
         * In User mode, UNPREDICTABLE; we choose UNDEF.
         * In Hyp mode, UNDEFINED.
         */
        if (IS_USER(s) || s->current_el == 2) {
            unallocated_encoding(s);
            return true;
        }
        /* There is no writeback of nzcv to PSTATE.  */
        *as = 0;
        ret = STREG_EXC_RET;
    } else if (rd == 13) {
        ret = STREG_SP_CHECK;
    }

    return ret;
}